

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

WMMAAccessChain dxil_spv::build_wmma_access_chain(Impl *impl,Value *offset,Value *stride)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *pOVar3;
  mapped_type *meta;
  Operation *this_00;
  LoggingCallback p_Var4;
  void *pvVar5;
  ulong uVar6;
  uint32_t uVar7;
  char *__ptr;
  WMMAAccessChain WVar8;
  size_t sStack_1050;
  char buffer [4096];
  
  this = Converter::Impl::builder(impl);
  if ((impl->ags).active_uav_op == AtomicBinOp) {
    IVar1 = spv::Builder::makeUintType(this,0x20);
    IVar1 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar1);
    pOVar3 = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
    Operation::add_id(pOVar3,(impl->ags).active_uav_ptr);
    IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
    Operation::add_id(pOVar3,IVar1);
    Converter::Impl::add(impl,pOVar3,false);
    IVar1 = pOVar3->id;
LAB_0016d825:
    uVar7 = 0;
    IVar2 = Converter::Impl::get_id_for_value(impl,stride,0);
    uVar6 = (ulong)IVar2;
  }
  else {
    meta = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&(impl->ags).active_uav_ptr);
    if ((meta->storage == StorageClassStorageBuffer) || ((impl->ags).active_uav_op == AtomicBinOp))
    {
      IVar1 = get_buffer_alias_handle(impl,meta,(impl->ags).active_uav_ptr,Integer,B8,V1);
      if (IVar1 != 0) {
        IVar2 = spv::Builder::makeUintType(this,8);
        IVar2 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
        pOVar3 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
        Operation::add_id(pOVar3,IVar1);
        IVar1 = spv::Builder::makeUintConstant(this,0,false);
        Operation::add_id(pOVar3,IVar1);
        IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
        Operation::add_id(pOVar3,IVar1);
        Converter::Impl::add(impl,pOVar3,false);
        IVar1 = pOVar3->id;
        goto LAB_0016d825;
      }
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Failed to get buffer alias.\n";
        sStack_1050 = 0x25;
        goto LAB_0016d8ed;
      }
      builtin_strncpy(buffer + 0x10,"ffer alias.\n",0xd);
      buffer[0] = 'F';
      buffer[1] = 'a';
      buffer[2] = 'i';
      buffer[3] = 'l';
      buffer[4] = 'e';
      buffer[5] = 'd';
      buffer[6] = ' ';
      buffer[7] = 't';
      buffer[8] = 'o';
      buffer[9] = ' ';
      buffer[10] = 'g';
      buffer[0xb] = 'e';
      buffer[0xc] = 't';
      buffer[0xd] = ' ';
      buffer[0xe] = 'b';
      buffer[0xf] = 'u';
LAB_0016d88c:
      pvVar5 = get_thread_log_callback_userdata();
      (*p_Var4)(pvVar5,Error,buffer);
    }
    else {
      if (meta->storage == StorageClassPhysicalStorageBuffer) {
        IVar1 = (impl->ags).u8_array_bda_type;
        if (IVar1 == 0) {
          IVar1 = spv::Builder::makeUintType(this,8);
          IVar1 = spv::Builder::makeRuntimeArray(this,IVar1);
          (impl->ags).u8_array_bda_type = IVar1;
          spv::Builder::addDecoration(this,IVar1,DecorationArrayStride,1);
          IVar1 = (impl->ags).u8_array_bda_type;
        }
        IVar1 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar1);
        pOVar3 = Converter::Impl::allocate(impl,OpBitcast,IVar1);
        Operation::add_id(pOVar3,(impl->ags).active_uav_ptr);
        Converter::Impl::add(impl,pOVar3,false);
        IVar1 = spv::Builder::makeUintType(this,8);
        IVar1 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar1);
        this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
        Operation::add_id(this_00,pOVar3->id);
        IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
        Operation::add_id(this_00,IVar1);
        Converter::Impl::add(impl,this_00,false);
        IVar1 = this_00->id;
        IVar2 = Converter::Impl::get_id_for_value(impl,stride,0);
        uVar6 = (ulong)IVar2;
        spv::Builder::addCapability(this,CapabilityInt8);
        uVar7 = 0x10;
        goto LAB_0016d8a7;
      }
      p_Var4 = get_thread_log_callback();
      if (p_Var4 != (LoggingCallback)0x0) {
        builtin_strncpy(buffer + 0x20,"ad-store.\n",0xb);
        builtin_strncpy(buffer + 0x10,"SSBO for WMMA lo",0x10);
        buffer[0] = 'E';
        buffer[1] = 'x';
        buffer[2] = 'p';
        buffer[3] = 'e';
        buffer[4] = 'c';
        buffer[5] = 't';
        buffer[6] = 'e';
        buffer[7] = 'd';
        buffer[8] = ' ';
        buffer[9] = 'B';
        buffer[10] = 'D';
        buffer[0xb] = 'A';
        buffer[0xc] = ' ';
        buffer[0xd] = 'o';
        buffer[0xe] = 'r';
        buffer[0xf] = ' ';
        goto LAB_0016d88c;
      }
      __ptr = "[ERROR]: Expected BDA or SSBO for WMMA load-store.\n";
      sStack_1050 = 0x33;
LAB_0016d8ed:
      fwrite(__ptr,sStack_1050,1,_stderr);
      fflush(_stderr);
    }
    uVar7 = 0;
    uVar6 = 0;
    IVar1 = 0;
  }
LAB_0016d8a7:
  WVar8._0_8_ = (ulong)IVar1 | uVar6 << 0x20;
  WVar8.alignment = uVar7;
  return WVar8;
}

Assistant:

static WMMAAccessChain build_wmma_access_chain(
	Converter::Impl &impl, const llvm::Value *offset, const llvm::Value *stride)
{
	WMMAAccessChain ret = {};
	auto &builder = impl.builder();

	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		// LDS access chains are in terms of u32 elements for whatever reason ...
		// This is convenient for us however, since SPIR-V is defined the same way.
		// TODO: Unsure what happens if the LDS pointer is u16, but FSR4 doesn't use that, so whatever.
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
		chain->add_id(impl.ags.active_uav_ptr);
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		return ret;
	}

	// Build the actual load.
	const auto &meta = impl.handle_to_resource_meta[impl.ags.active_uav_ptr];

	if (meta.storage == spv::StorageClassStorageBuffer || impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		spv::Id buffer_id = get_buffer_alias_handle(
			impl, meta, impl.ags.active_uav_ptr, RawType::Integer, RawWidth::B8, RawVecSize::V1);

		if (!buffer_id)
		{
			LOGE("Failed to get buffer alias.\n");
			return ret;
		}

		// Cooperative matrix is in terms of elements of the value type, not bytes.
		// We could use 8-bit storage, but that means adding a lot of extra cruft ...
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassStorageBuffer, builder.makeUintType(8)));
		chain->add_id(buffer_id);
		chain->add_id(builder.makeUintConstant(0));
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
	}
	else if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (!impl.ags.u8_array_bda_type)
		{
			impl.ags.u8_array_bda_type = builder.makeRuntimeArray(builder.makeUintType(8));
			builder.addDecoration(impl.ags.u8_array_bda_type, spv::DecorationArrayStride, 1);
		}

		auto *cast = impl.allocate(spv::OpBitcast,
		                           builder.makePointer(spv::StorageClassPhysicalStorageBuffer, impl.ags.u8_array_bda_type));

		cast->add_id(impl.ags.active_uav_ptr);
		impl.add(cast);

		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassPhysicalStorageBuffer, builder.makeUintType(8)));
		chain->add_id(cast->id);
		chain->add_id(impl.get_id_for_value(offset));
		impl.add(chain);

		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		ret.alignment = 16; // Unsure what requirements are here. Just do the simple thing.

		builder.addCapability(spv::CapabilityInt8);
	}
	else
	{
		LOGE("Expected BDA or SSBO for WMMA load-store.\n");
	}

	return ret;
}